

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi_is_16_bit(char *filename)

{
  int iVar1;
  FILE *__stream;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    stbi__g_failure_reason = "can\'t fopen";
    iVar1 = 0;
  }
  else {
    iVar1 = stbi_is_16_bit_from_file((FILE *)__stream);
    fclose(__stream);
  }
  return iVar1;
}

Assistant:

STBIDEF int stbi_is_16_bit(char const *filename)
{
    FILE *f = stbi__fopen(filename, "rb");
    int result;
    if (!f) return stbi__err("can't fopen", "Unable to open file");
    result = stbi_is_16_bit_from_file(f);
    fclose(f);
    return result;
}